

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void determine_input_device(void)

{
  ostream *this;
  char cVar1;
  int iVar2;
  istream *piVar3;
  long lVar4;
  ulong uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  results;
  string line;
  stringstream input_dev_path;
  stringstream output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  undefined1 *local_380;
  ulong local_378;
  undefined1 local_370 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  undefined1 local_340 [128];
  ios_base local_2c0 [264];
  long local_1b8 [16];
  ios_base local_138 [264];
  
  setegid(0xfffe);
  seteuid(0xfffe);
  execute_abi_cxx11_((string *)local_340,
                     "/bin/grep -E \'Handlers|EV=\' /proc/bus/input/devices | /bin/grep -B1 \'EV=1[02]001[3Ff]\' | /bin/grep -Eo \'event[0-9]+\' "
                    );
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_1b8,(string *)local_340,_S_out|_S_in);
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_);
  }
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_380 = local_370;
  local_378 = 0;
  local_370[0] = 0;
  this = (ostream *)(local_340 + 0x10);
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_1b8[0] + -0x18) +
                            (char)(stringstream *)local_1b8);
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b8,(string *)&local_380,cVar1);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    lVar4 = std::__cxx11::string::find((char *)&local_380,0x1098f0,0);
    uVar5 = lVar4 + 5;
    if (lVar4 == -1) {
      uVar5 = 0xffffffffffffffff;
    }
    if (uVar5 < local_378) {
      iVar2 = atoi(local_380 + uVar5);
      if (iVar2 != -1) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_340);
        std::__ostream_insert<char,std::char_traits<char>>(this,"/dev/input/",0xb);
        std::__ostream_insert<char,std::char_traits<char>>(this,"event",5);
        std::ostream::operator<<(this,iVar2);
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_398,
                   &local_360);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
        std::ios_base::~ios_base(local_2c0);
      }
    }
  }
  if (local_398.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_398.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    error(0,0,"Couldn\'t determine keyboard device. :/");
    error(1,0,
          "Please post contents of your /proc/bus/input/devices file as a new bug report. Thanks!");
  }
  std::__cxx11::string::_M_assign((string *)&args.device);
  seteuid(0);
  setegid(0);
  if (local_380 != local_370) {
    operator_delete(local_380);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_398);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void determine_input_device()
{
    // better be safe than sory: while running other programs, switch user to nobody
    setegid(65534); seteuid(65534);

    // extract input number from /proc/bus/input/devices (I don't know how to do it better. If you have an idea, please let me know.)
    // The compiler automatically concatenates these adjacent strings to a single string.
    const char* cmd = EXE_GREP " -E 'Handlers|EV=' /proc/bus/input/devices | "
                      EXE_GREP " -B1 'EV=1[02]001[3Ff]' | "
                      EXE_GREP " -Eo 'event[0-9]+' ";
    std::stringstream output(execute(cmd));

    std::vector<std::string> results;
    std::string line;

    while(std::getline(output, line)) {
        std::string::size_type i = line.find("event");
        if (i != std::string::npos) i += 5;                         // "event".size() == 5
        if (i < line.size()) {
            int index = atoi(&line.c_str()[i]);

            if (index != -1) {
                std::stringstream input_dev_path;
                input_dev_path << INPUT_EVENT_PATH;
                input_dev_path << "event";
                input_dev_path << index;

                results.push_back(input_dev_path.str());
            }
        }
    }

    if (results.size() == 0) {
        error(0, 0, "Couldn't determine keyboard device. :/");
        error(EXIT_FAILURE, 0, "Please post contents of your /proc/bus/input/devices file as a new bug report. Thanks!");
    }

    args.device = results[0];             // for now, use only the first found device

    // now we reclaim those root privileges
    seteuid(0); setegid(0);
}